

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O3

bool MeCab::FeatureIndex::convert(Param *param,char *txtfile,string *output)

{
  char cVar1;
  char *pcVar2;
  pair<unsigned_long,_double> *ppVar3;
  iterator iVar4;
  string *psVar5;
  Param *this;
  bool bVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  size_t sVar10;
  char *__s;
  long *plVar11;
  char *pcVar12;
  uint64_t uVar13;
  ulong uVar14;
  char **ppcVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  string model_charset;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_> dic;
  double alpha;
  string from;
  char charset_buf [32];
  Iconv iconv;
  string to;
  char *column [4];
  uint size;
  ifstream ifs;
  char *local_338;
  char *local_330;
  char local_328 [16];
  pair<unsigned_long,_double> *local_318;
  iterator iStack_310;
  pair<unsigned_long,_double> *local_308;
  pair<unsigned_long,_double> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8;
  Iconv local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  char *local_278 [4];
  string *local_258;
  Param *local_250;
  char *local_248;
  undefined4 local_23c;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_250 = param;
  std::ifstream::ifstream(local_238,txtfile,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x21d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"ifs",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"no such file or directory: ",0x1b);
    if (txtfile == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar10 = strlen(txtfile);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,txtfile,sVar10);
    }
    die::~die((die *)local_278);
  }
  local_258 = output;
  __s = (char *)operator_new__(0x2000);
  local_308 = (pair<unsigned_long,_double> *)0x0;
  local_318 = (pair<unsigned_long,_double> *)0x0;
  iStack_310._M_current = (pair<unsigned_long,_double> *)0x0;
  local_338 = local_328;
  local_330 = (char *)0x0;
  local_328[0] = '\0';
  local_248 = __s;
  do {
    cVar1 = (char)local_238;
    std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar1);
    plVar11 = (long *)std::istream::getline((char *)local_238,(long)__s,'\0');
    this = local_250;
    if (((*(byte *)((long)plVar11 + *(long *)(*plVar11 + -0x18) + 0x20) & 5) != 0) || (*__s == '\0')
       ) {
      Param::get<std::__cxx11::string>(&local_2e8,local_250,"dictionary-charset");
      Param::get<std::__cxx11::string>(&local_298,this,"charset");
      if (local_2e8._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_2e8);
      }
      else {
        iVar7 = decode_charset(local_338);
        iVar8 = decode_charset(local_2e8._M_dataplus._M_p);
        if (iVar7 != iVar8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x233);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"decode_charset(model_charset.c_str()) == decode_charset(from.c_str())",
                     0x45);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"dictionary charset and model charset are different. ",0x34);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"dictionary_charset=",0x13);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," model_charset=",0xf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_338,(long)local_330);
          die::~die((die *)&local_2c8);
        }
      }
      if (local_298._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_298);
      }
      Iconv::Iconv(&local_2a8);
      iVar7 = Iconv::open(&local_2a8,local_2e8._M_dataplus._M_p,(int)local_298._M_dataplus._M_p);
      if ((char)iVar7 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x240);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"iconv.open(from.c_str(), to.c_str())",0x24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"cannot create model from=",0x19);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," to=",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,local_298._M_dataplus._M_p,local_298._M_string_length);
        die::~die((die *)&local_2c8);
      }
      do {
        std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar1);
        plVar11 = (long *)std::istream::getline((char *)local_238,(long)__s,'\0');
        psVar5 = local_258;
        if ((*(byte *)((long)plVar11 + *(long *)(*plVar11 + -0x18) + 0x20) & 5) != 0) {
          local_258->_M_string_length = 0;
          *(local_258->_M_dataplus)._M_p = '\0';
          local_23c = (undefined4)((ulong)((long)iStack_310._M_current - (long)local_318) >> 4);
          std::__cxx11::string::append((char *)local_258,(ulong)&local_23c);
          local_2c8.field_2._M_allocated_capacity = 0;
          local_2c8.field_2._8_8_ = 0;
          local_2c8._M_dataplus._M_p = (pointer)0x0;
          local_2c8._M_string_length = 0;
          strncpy((char *)&local_2c8,local_298._M_dataplus._M_p,0x1f);
          std::__cxx11::string::append((char *)psVar5,(ulong)&local_2c8);
          iVar4._M_current = iStack_310._M_current;
          ppVar3 = local_318;
          if (local_318 != iStack_310._M_current) {
            uVar14 = (long)iStack_310._M_current - (long)local_318 >> 4;
            lVar18 = 0x3f;
            if (uVar14 != 0) {
              for (; uVar14 >> lVar18 == 0; lVar18 = lVar18 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_318,iStack_310._M_current,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (ppVar3,iVar4._M_current);
            if (iStack_310._M_current != local_318) {
              lVar18 = 8;
              uVar14 = 0;
              do {
                local_2f8.first = *(uint64_t *)((long)&local_318->first + lVar18);
                std::__cxx11::string::append((char *)psVar5,(ulong)&local_2f8);
                uVar14 = uVar14 + 1;
                lVar18 = lVar18 + 0x10;
              } while (uVar14 < (ulong)((long)iStack_310._M_current - (long)local_318 >> 4));
              if (iStack_310._M_current != local_318) {
                lVar18 = 0;
                uVar14 = 0;
                do {
                  local_2f8.first = *(uint64_t *)((long)&local_318->first + lVar18);
                  std::__cxx11::string::append((char *)psVar5,(ulong)&local_2f8);
                  uVar14 = uVar14 + 1;
                  lVar18 = lVar18 + 0x10;
                } while (uVar14 < (ulong)((long)iStack_310._M_current - (long)local_318 >> 4));
              }
            }
          }
          Iconv::~Iconv(&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p);
          }
          if (local_338 != local_328) {
            operator_delete(local_338);
          }
          if (local_318 != (pair<unsigned_long,_double> *)0x0) {
            operator_delete(local_318);
          }
          operator_delete__(__s);
          std::ifstream::~ifstream(local_238);
          return true;
        }
        sVar10 = strlen(__s);
        pcVar12 = __s + sVar10;
        ppcVar15 = local_278;
        uVar14 = 0;
        pcVar16 = __s;
        do {
          pcVar2 = pcVar16;
          if (1 < uVar14) break;
          for (; (pcVar17 = pcVar12, pcVar2 != pcVar12 && (pcVar17 = pcVar2, *pcVar2 != '\t'));
              pcVar2 = pcVar2 + 1) {
          }
          *pcVar17 = '\0';
          if (*pcVar16 != '\0') {
            *ppcVar15 = pcVar16;
            ppcVar15 = ppcVar15 + 1;
            uVar14 = uVar14 + 1;
          }
          pcVar16 = pcVar17 + 1;
        } while (pcVar17 != pcVar12);
        if (uVar14 != 2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x245);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"tokenize2(buf.get(), \"\\t\", column, 2) == 2",0x2a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"format error: ",0xe);
          sVar10 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s,sVar10);
          die::~die((die *)&local_2c8);
        }
        std::__cxx11::string::string((string *)&local_2c8,local_278[1],(allocator *)&local_2f8);
        bVar6 = Iconv::convert(&local_2a8,&local_2c8);
        if (!bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x248);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"iconv.convert(&feature)",0x17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
          die::~die((die *)&local_2f8);
        }
        uVar13 = fingerprint(&local_2c8);
        local_2f8.second = atof(local_278[0]);
        local_2f8.first = uVar13;
        if (iStack_310._M_current == local_308) {
          std::
          vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
          _M_realloc_insert<std::pair<unsigned_long,double>>
                    ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                      *)&local_318,iStack_310,&local_2f8);
        }
        else {
          (iStack_310._M_current)->first = uVar13;
          (iStack_310._M_current)->second = local_2f8.second;
          iStack_310._M_current = iStack_310._M_current + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p);
        }
      } while( true );
    }
    sVar10 = strlen(__s);
    pcVar12 = __s + sVar10;
    uVar14 = 0;
    ppcVar15 = local_278;
    pcVar16 = __s;
    do {
      pcVar2 = pcVar16;
      if (1 < uVar14) break;
      for (; (pcVar17 = pcVar12, pcVar2 != pcVar12 && (pcVar17 = pcVar2, *pcVar2 != ':'));
          pcVar2 = pcVar2 + 1) {
      }
      *pcVar17 = '\0';
      if (*pcVar16 != '\0') {
        *ppcVar15 = pcVar16;
        ppcVar15 = ppcVar15 + 1;
        uVar14 = uVar14 + 1;
      }
      pcVar16 = pcVar17 + 1;
    } while (pcVar17 != pcVar12);
    if (uVar14 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x227);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"tokenize2(buf.get(), \":\", column, 2) == 2",0x29);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"format error: ",0xe);
      sVar10 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s,sVar10);
      die::~die((die *)&local_2e8);
    }
    std::__cxx11::string::string((string *)&local_2e8,local_278[0],(allocator *)&local_298);
    iVar7 = std::__cxx11::string::compare((char *)&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p);
    }
    pcVar16 = local_330;
    if (iVar7 == 0) {
      pcVar12 = local_278[1] + 1;
      strlen(pcVar12);
      __s = local_248;
      std::__cxx11::string::_M_replace((ulong)&local_338,0,pcVar16,(ulong)pcVar12);
    }
  } while( true );
}

Assistant:

bool FeatureIndex::convert(const Param &param,
                           const char* txtfile, std::string *output) {
  std::ifstream ifs(WPATH(txtfile));
  CHECK_DIE(ifs) << "no such file or directory: " << txtfile;
  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[4];
  std::vector<std::pair<uint64_t, double> > dic;
  std::string model_charset;

  while (ifs.getline(buf.get(), buf.size())) {
    if (std::strlen(buf.get()) == 0) {
      break;
    }
    CHECK_DIE(tokenize2(buf.get(), ":", column, 2) == 2)
        << "format error: " << buf.get();
    if (std::string(column[0]) == "charset") {
      model_charset = column[1] + 1;
    }
  }

  std::string from = param.get<std::string>("dictionary-charset");
  std::string to = param.get<std::string>("charset");

  if (!from.empty()) {
    CHECK_DIE(decode_charset(model_charset.c_str())
              == decode_charset(from.c_str()))
        << "dictionary charset and model charset are different. "
        << "dictionary_charset=" << from
        << " model_charset=" << model_charset;
  } else {
    from = model_charset;
  }

  if (to.empty()) {
    to = from;
  }

  Iconv iconv;
  CHECK_DIE(iconv.open(from.c_str(), to.c_str()))
            << "cannot create model from=" << from
            << " to=" << to;

  while (ifs.getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t", column, 2) == 2)
        << "format error: " << buf.get();
    std::string feature = column[1];
    CHECK_DIE(iconv.convert(&feature));
    const uint64_t fp = fingerprint(feature);
    const double alpha = atof(column[0]);
    dic.push_back(std::pair<uint64_t, double>(fp, alpha));
  }

  output->clear();
  unsigned int size = static_cast<unsigned int>(dic.size());
  output->append(reinterpret_cast<const char*>(&size), sizeof(size));

  char charset_buf[32];
  std::fill(charset_buf, charset_buf + sizeof(charset_buf), '\0');
  std::strncpy(charset_buf, to.c_str(), 31);
  output->append(reinterpret_cast<const char *>(charset_buf),
                 sizeof(charset_buf));

  std::sort(dic.begin(), dic.end());

  for (size_t i = 0; i < dic.size(); ++i) {
    const double alpha = dic[i].second;
    output->append(reinterpret_cast<const char *>(&alpha), sizeof(alpha));
  }

  for (size_t i = 0; i < dic.size(); ++i) {
    const uint64_t fp = dic[i].first;
    output->append(reinterpret_cast<const char *>(&fp), sizeof(fp));
  }

  return true;
}